

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  ushort *puVar10;
  int iVar11;
  ushort *puVar12;
  undefined8 uVar13;
  uint *puVar14;
  undefined8 uVar15;
  Arena *arena;
  undefined8 uVar16;
  int iVar17;
  long *plVar18;
  ushort *local_58 [2];
  long local_48;
  long local_40;
  long local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  bVar1 = *ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar14 & 3) != 0) {
      AlignFail(puVar14);
    }
    *puVar14 = *puVar14 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar18 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar18 & 7) != 0) {
    AlignFail(plVar18);
  }
  lVar3 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  pMVar6 = (MessageLite *)*plVar18;
  if (pMVar6 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(*(ClassData **)(lVar3 + 0x20),arena);
    *plVar18 = (long)pMVar6;
  }
  iVar17 = ctx->depth_;
  local_38 = (long)iVar17 + -1;
  ctx->depth_ = (int)local_38;
  if ((long)iVar17 < 1) {
    puVar12 = (ushort *)0x0;
  }
  else {
    local_58[0] = (ushort *)(ptr + 1);
    local_40 = (long)ctx->group_depth_;
    local_48 = local_40 + 1;
    ctx->group_depth_ = (int)local_48;
    while (bVar4 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)local_58,ctx->group_depth_),
          !bVar4) {
      uVar5 = (uint)*(byte *)(lVar3 + 8) & (uint)*local_58[0];
      if ((uVar5 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar7 = (ulong)(uVar5 & 0xfffffff8);
      local_58[0] = (ushort *)
                    (**(code **)(lVar3 + 0x38 + uVar7 * 2))
                              (pMVar6,local_58[0],ctx,
                               (ulong)*local_58[0] ^ *(ulong *)(lVar3 + 0x40 + uVar7 * 2),lVar3,0);
      if ((local_58[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar10 = local_58[0];
    if ((*(byte *)(lVar3 + 9) & 1) != 0) {
      puVar10 = (ushort *)(**(code **)(lVar3 + 0x28))(pMVar6,local_58[0],ctx);
    }
    if (puVar10 == (ushort *)0x0) {
      iVar11 = ctx->group_depth_ + -1;
      iVar17 = ctx->depth_ + 1;
    }
    else {
      if ((int)local_38 != ctx->depth_) {
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (local_38,(long)ctx->depth_,"old_depth == depth_");
        uVar16 = *(undefined8 *)psVar8;
        uVar13 = *(undefined8 *)(psVar8 + 8);
        uVar15 = 0x45b;
LAB_0014cd20:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar15,uVar13,uVar16);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_58);
      }
      iVar11 = (int)local_40;
      if ((int)local_48 != ctx->group_depth_) {
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (local_48,(long)ctx->group_depth_,"old_group_depth == group_depth_");
        uVar16 = *(undefined8 *)psVar8;
        uVar13 = *(undefined8 *)(psVar8 + 8);
        uVar15 = 0x45c;
        goto LAB_0014cd20;
      }
    }
    ctx->group_depth_ = iVar11;
    ctx->depth_ = iVar17;
    uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar12 = (ushort *)0x0;
    if (uVar2 == bVar1) {
      puVar12 = puVar10;
    }
  }
  return (char *)puVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}